

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_font_text_width(nk_handle handle,float height,char *text,int len)

{
  float fVar1;
  nk_font_glyph *pnVar2;
  nk_font_glyph *g;
  nk_font *font;
  float scale;
  int glyph_len;
  float text_width;
  int text_len;
  nk_rune unicode;
  int len_local;
  char *text_local;
  nk_handle nStack_18;
  float height_local;
  nk_handle handle_local;
  
  scale = 0.0;
  text_len = len;
  _unicode = text;
  text_local._4_4_ = height;
  nStack_18 = handle;
  if (handle.ptr == (void *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x32d8,"float nk_font_text_width(nk_handle, float, const char *, int)");
  }
  if (*(long *)((long)handle.ptr + 0x58) == 0) {
    __assert_fail("font->glyphs",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x32d9,"float nk_font_text_width(nk_handle, float, const char *, int)");
  }
  if (((handle.ptr == (void *)0x0) || (text == (char *)0x0)) || (len == 0)) {
    handle_local._4_4_ = 0;
  }
  else {
    fVar1 = *(float *)((long)handle.ptr + 0x30);
    font._4_4_ = nk_utf_decode(text,(nk_rune *)&text_width,len);
    glyph_len = font._4_4_;
    if (font._4_4_ == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      while ((glyph_len <= text_len && font._4_4_ != 0 && (text_width != 9.18313e-41))) {
        pnVar2 = nk_font_find_glyph((nk_font *)handle.ptr,(nk_rune)text_width);
        scale = pnVar2->xadvance * (height / fVar1) + scale;
        font._4_4_ = nk_utf_decode(_unicode + glyph_len,(nk_rune *)&text_width,text_len - glyph_len)
        ;
        glyph_len = font._4_4_ + glyph_len;
      }
      handle_local._4_4_ = scale;
    }
  }
  return (float)handle_local._4_4_;
}

Assistant:

NK_INTERN float
nk_font_text_width(nk_handle handle, float height, const char *text, int len)
{
    nk_rune unicode;
    int text_len  = 0;
    float text_width = 0;
    int glyph_len = 0;
    float scale = 0;

    struct nk_font *font = (struct nk_font*)handle.ptr;
    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    if (!font || !text || !len)
        return 0;

    scale = height/font->info.height;
    glyph_len = text_len = nk_utf_decode(text, &unicode, (int)len);
    if (!glyph_len) return 0;
    while (text_len <= (int)len && glyph_len) {
        const struct nk_font_glyph *g;
        if (unicode == NK_UTF_INVALID) break;

        /* query currently drawn glyph information */
        g = nk_font_find_glyph(font, unicode);
        text_width += g->xadvance * scale;

        /* offset next glyph */
        glyph_len = nk_utf_decode(text + text_len, &unicode, (int)len - text_len);
        text_len += glyph_len;
    }
    return text_width;
}